

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O2

handle * __thiscall
gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock
          (handle *__return_storage_ptr__,cow_guarded<int,_std::timed_mutex> *this)

{
  atomic<int> *paVar1;
  __int_type _Var2;
  mutex_type *pmVar3;
  bool bVar4;
  uint uVar5;
  int *piVar6;
  unique_lock<std::timed_mutex> guard;
  unique_ptr<int,_std::default_delete<int>_> val;
  unique_lock<std::timed_mutex> local_48;
  cow_guarded<int,_std::timed_mutex> *local_38;
  undefined1 local_30;
  
  std::unique_lock<std::timed_mutex>::unique_lock(&guard,&this->m_writeMutex);
  uVar5 = (byte)~(this->m_data).m_countingLeft._M_base._M_i & 1;
  LOCK();
  paVar1 = &(this->m_data).m_leftReadCount + uVar5;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  _Var2 = (this->m_data).m_readingLeft._M_base._M_i;
  piVar6 = (int *)operator_new(4);
  bVar4 = guard._M_owns;
  pmVar3 = guard._M_device;
  *piVar6 = **(int **)((long)&(this->m_data).m_left.
                              super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                      (ulong)(((byte)~_Var2 & 1) << 4));
  LOCK();
  paVar1 = &(this->m_data).m_leftReadCount + uVar5;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  val._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
  guard._M_device = (mutex_type *)0x0;
  guard._M_owns = false;
  local_30 = 0;
  local_48._M_device = (mutex_type *)0x0;
  *(mutex_type **)
   &(__return_storage_ptr__->
    super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>)._M_t.
    super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
    super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
    super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false> =
       pmVar3;
  *(bool *)((long)&(__return_storage_ptr__->
                   super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   )._M_t.
                   super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
           + 8) = bVar4;
  local_48._M_owns = false;
  *(bool *)((long)&(__return_storage_ptr__->
                   super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   )._M_t.
                   super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
           + 0x18) = false;
  *(cow_guarded<int,_std::timed_mutex> **)
   ((long)&(__return_storage_ptr__->
           super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>).
           _M_t.
           super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
           ._M_t.
           super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
           .super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
           super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
   + 0x10) = this;
  (__return_storage_ptr__->
  super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>)._M_t.
  super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t.
  super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl = piVar6;
  local_38 = this;
  std::unique_lock<std::timed_mutex>::~unique_lock(&local_48);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&val);
  std::unique_lock<std::timed_mutex>::~unique_lock(&guard);
  return __return_storage_ptr__;
}

Assistant:

auto cow_guarded<T, M>::lock() -> handle
{
    std::unique_lock<M> guard(m_writeMutex);

    auto data(m_data.lock_shared());
    std::unique_ptr<T> val(new T(**data));
    data.reset();

    return handle(val.release(), deleter(std::move(guard), *this));
}